

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

bool_t ecpSeemsValidGroup(ec_o *ec,void *stack)

{
  size_t m;
  word *a;
  bool_t bVar1;
  int iVar2;
  word wVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  word *pwVar7;
  word *stack_00;
  
  m = ec->f->n;
  bVar1 = ecIsOperableGroup(ec);
  uVar5 = 0;
  uVar6 = 0;
  if (bVar1 != 0) {
    pwVar7 = (word *)((long)stack + m * 8);
    stack_00 = pwVar7 + m * 3 + 3;
    bVar1 = ecpIsOnA(ec->base,ec,stack_00);
    uVar6 = uVar5;
    if (bVar1 != 0) {
      wVar3 = zzMulW((word *)stack,ec->order,m + 1,ec->cofactor);
      *(word *)((long)stack + m * 8 + 8) = wVar3;
      sVar4 = m + 2;
      wVar3 = zzSubW2((word *)stack,sVar4,1);
      if (wVar3 == 0) {
        iVar2 = wwCmp2((word *)stack,sVar4,ec->f->mod,m);
        a = ec->f->mod;
        if (iVar2 < 0) {
          zzSub((word *)stack,a,(word *)stack,m);
        }
        else {
          wVar3 = zzSub2((word *)stack,a,m);
          zzSubW2(pwVar7,2,wVar3);
        }
        sVar4 = wwWordSize((word *)stack,sVar4);
        if (sVar4 <= ec->f->n) {
          pwVar7 = (word *)((long)stack + m * 8 + 8);
          zzSqr(pwVar7,(word *)stack,sVar4,stack_00);
          uVar6 = 0;
          wVar3 = wwGetBits(pwVar7,0,2);
          wwShLo(pwVar7,sVar4 * 2,2);
          iVar2 = wwCmp2(pwVar7,sVar4 * 2,ec->f->mod,ec->f->n);
          if (iVar2 < 1) {
            uVar6 = (uint)(wVar3 == 0 || iVar2 != 0);
          }
        }
      }
    }
  }
  return uVar6;
}

Assistant:

bool_t ecpSeemsValidGroup(const ec_o* ec, void* stack)
{
	size_t n = ec->f->n;
	int cmp;
	word w;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n + 1;
	word* t3 = t2 + n + 2;
	stack = t3 + 2 * n;
	// pre
	ASSERT(ecIsOperable(ec));
	// ecIsOperableGroup(ec) == TRUE? base \in ec?
	if (!ecIsOperableGroup(ec) ||
		!ecpIsOnA(ec->base, ec, stack))
		return FALSE;
	// [n + 2]t1 <- order * cofactor
	t1[n + 1] = zzMulW(t1, ec->order, n + 1, ec->cofactor);
	// t1 <- |t1 - (p + 1)|
	if (zzSubW2(t1, n + 2, 1))
		return FALSE;
	if (wwCmp2(t1, n + 2, ec->f->mod, n) >= 0)
		zzSubW2(t1 + n, 2, zzSub2(t1, ec->f->mod, n));
	else
		zzSub(t1, ec->f->mod, t1, n);
	// n <- длина t1
	n = wwWordSize(t1, n + 2);
	// n > ec->f->n => t1^2 > 4 p
	if (n > ec->f->n)
		return FALSE;
	// [2n]t2 <- ([n]t1)^2
	zzSqr(t2, t1, n, stack);
	// условие Хассе: t2 <= 4 p?
	w = wwGetBits(t2, 0, 2);
	wwShLo(t2, 2 * n, 2);
	cmp = wwCmp2(t2, 2 * n, ec->f->mod, ec->f->n);
	if (cmp > 0 || cmp == 0 && w != 0)
		return FALSE;
	// все нормально
	return TRUE;
}